

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O2

void wasm::PostWalker<Creator,_wasm::Visitor<Creator,_void>_>::scan
               (Creator *self,Expression **currp)

{
  Expression *this;
  Block *pBVar1;
  Resume *pRVar2;
  StackSwitch *pSVar3;
  Expression **ppEVar4;
  AtomicWait *pAVar5;
  ContBind *pCVar6;
  TryTable *pTVar7;
  GlobalSet *pGVar8;
  CallRef *pCVar9;
  StructGet *pSVar10;
  Call *pCVar11;
  AtomicCmpxchg *pAVar12;
  CallIndirect *pCVar13;
  Load *pLVar14;
  Try *pTVar15;
  Break *pBVar16;
  Switch *pSVar17;
  ArrayNew *pAVar18;
  Return *pRVar19;
  StructNew *pSVar20;
  SIMDLoad *pSVar21;
  Suspend *pSVar22;
  Store *pSVar23;
  Throw *pTVar24;
  MemoryCopy *pMVar25;
  ResumeThrow *pRVar26;
  TupleMake *pTVar27;
  ArrayNewFixed *pAVar28;
  ulong uVar29;
  
  this = *currp;
  switch(this->_id) {
  case InvalidId:
  case NumExpressionIds:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-delegations-fields.def"
                       ,0x103);
  case BlockId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitBlock,currp);
    pBVar1 = Expression::cast<wasm::Block>(this);
    uVar29 = (ulong)(uint)(pBVar1->list).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pBVar1->list).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
                ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,ppEVar4);
    }
    break;
  case IfId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitIf,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::If>(this);
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::maybePushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,&pMVar25->size);
    goto LAB_00ac52fc;
  case LoopId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitLoop,currp);
    pGVar8 = (GlobalSet *)Expression::cast<wasm::Loop>(this);
    goto LAB_00ac4ed5;
  case BreakId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitBreak,currp);
    pBVar16 = Expression::cast<wasm::Break>(this);
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::maybePushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,&pBVar16->condition);
    ppEVar4 = &pBVar16->value;
    goto LAB_00ac4dcf;
  case SwitchId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitSwitch,currp);
    pSVar17 = Expression::cast<wasm::Switch>(this);
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,&pSVar17->condition);
    ppEVar4 = &pSVar17->value;
    goto LAB_00ac4dcf;
  case CallId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitCall,currp);
    pCVar11 = Expression::cast<wasm::Call>(this);
    uVar29 = (ulong)(uint)(pCVar11->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pCVar11->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
                ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,ppEVar4);
    }
    break;
  case CallIndirectId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitCallIndirect,currp);
    pCVar13 = Expression::cast<wasm::CallIndirect>(this);
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,&pCVar13->target);
    uVar29 = (ulong)(uint)(pCVar13->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pCVar13->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
                ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,ppEVar4);
    }
    break;
  case LocalGetId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitLocalGet,currp);
    Expression::cast<wasm::LocalGet>(this);
    return;
  case LocalSetId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitLocalSet,currp);
    pSVar10 = (StructGet *)Expression::cast<wasm::LocalSet>(this);
    goto LAB_00ac512d;
  case GlobalGetId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitGlobalGet,currp);
    Expression::cast<wasm::GlobalGet>(this);
    return;
  case GlobalSetId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitGlobalSet,currp);
    pGVar8 = Expression::cast<wasm::GlobalSet>(this);
    goto LAB_00ac4ed5;
  case LoadId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitLoad,currp);
    pLVar14 = Expression::cast<wasm::Load>(this);
    ppEVar4 = &pLVar14->ptr;
    goto LAB_00ac5314;
  case StoreId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitStore,currp);
    pSVar23 = Expression::cast<wasm::Store>(this);
    goto LAB_00ac50f4;
  case ConstId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitConst,currp);
    Expression::cast<wasm::Const>(this);
    return;
  case UnaryId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitUnary,currp);
    pSVar10 = (StructGet *)Expression::cast<wasm::Unary>(this);
    goto LAB_00ac512d;
  case BinaryId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitBinary,currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::Binary>(this);
    goto LAB_00ac5096;
  case SelectId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitSelect,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::Select>(this);
    goto LAB_00ac52ed;
  case DropId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitDrop,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::Drop>(this);
    goto LAB_00ac4f66;
  case ReturnId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitReturn,currp);
    pRVar19 = Expression::cast<wasm::Return>(this);
    ppEVar4 = &pRVar19->value;
    goto LAB_00ac4dcf;
  case MemorySizeId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitMemorySize,currp);
    Expression::cast<wasm::MemorySize>(this);
    return;
  case MemoryGrowId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitMemoryGrow,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::MemoryGrow>(this);
    goto LAB_00ac4f66;
  case NopId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitNop,currp);
    Expression::cast<wasm::Nop>(this);
    return;
  case UnreachableId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitUnreachable,currp);
    Expression::cast<wasm::Unreachable>(this);
    return;
  case AtomicRMWId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitAtomicRMW,currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::AtomicRMW>(this);
    goto LAB_00ac5174;
  case AtomicCmpxchgId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitAtomicCmpxchg,currp);
    pAVar12 = Expression::cast<wasm::AtomicCmpxchg>(this);
    goto LAB_00ac5165;
  case AtomicWaitId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitAtomicWait,currp);
    pAVar5 = Expression::cast<wasm::AtomicWait>(this);
    goto LAB_00ac4ef5;
  case AtomicNotifyId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitAtomicNotify,currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::AtomicNotify>(this);
    goto LAB_00ac5096;
  case AtomicFenceId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitAtomicFence,currp);
    Expression::cast<wasm::AtomicFence>(this);
    return;
  case SIMDExtractId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitSIMDExtract,currp);
    pSVar10 = (StructGet *)Expression::cast<wasm::SIMDExtract>(this);
    goto LAB_00ac512d;
  case SIMDReplaceId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitSIMDReplace,currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::SIMDReplace>(this);
    ppEVar4 = &pAVar5->timeout;
    goto LAB_00ac50a4;
  case SIMDShuffleId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitSIMDShuffle,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::SIMDShuffle>(this);
    goto LAB_00ac52fc;
  case SIMDTernaryId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitSIMDTernary,currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::SIMDTernary>(this);
    goto LAB_00ac4ef5;
  case SIMDShiftId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitSIMDShift,currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::SIMDShift>(this);
    goto LAB_00ac5096;
  case SIMDLoadId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitSIMDLoad,currp);
    pSVar21 = Expression::cast<wasm::SIMDLoad>(this);
    goto LAB_00ac5030;
  case SIMDLoadStoreLaneId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitSIMDLoadStoreLane,currp);
    pSVar23 = (Store *)Expression::cast<wasm::SIMDLoadStoreLane>(this);
LAB_00ac50f4:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,&pSVar23->value);
    ppEVar4 = &pSVar23->ptr;
    goto LAB_00ac5314;
  case MemoryInitId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitMemoryInit,currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::MemoryInit>(this);
    goto LAB_00ac5165;
  case DataDropId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitDataDrop,currp);
    Expression::cast<wasm::DataDrop>(this);
    return;
  case MemoryCopyId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitMemoryCopy,currp);
    pMVar25 = Expression::cast<wasm::MemoryCopy>(this);
    goto LAB_00ac52ed;
  case MemoryFillId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitMemoryFill,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::MemoryFill>(this);
    goto LAB_00ac52ed;
  case PopId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitPop,currp);
    Expression::cast<wasm::Pop>(this);
    return;
  case RefNullId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitRefNull,currp);
    Expression::cast<wasm::RefNull>(this);
    return;
  case RefIsNullId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitRefIsNull,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::RefIsNull>(this);
    goto LAB_00ac4f66;
  case RefFuncId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitRefFunc,currp);
    Expression::cast<wasm::RefFunc>(this);
    return;
  case RefEqId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitRefEq,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::RefEq>(this);
    goto LAB_00ac52fc;
  case TableGetId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitTableGet,currp);
    pGVar8 = (GlobalSet *)Expression::cast<wasm::TableGet>(this);
LAB_00ac4ed5:
    ppEVar4 = &pGVar8->value;
    goto LAB_00ac5314;
  case TableSetId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitTableSet,currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::TableSet>(this);
    goto LAB_00ac5174;
  case TableSizeId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitTableSize,currp);
    Expression::cast<wasm::TableSize>(this);
    return;
  case TableGrowId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitTableGrow,currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::TableGrow>(this);
    goto LAB_00ac5174;
  case TableFillId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitTableFill,currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::TableFill>(this);
    goto LAB_00ac5165;
  case TableCopyId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitTableCopy,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::TableCopy>(this);
    goto LAB_00ac52ed;
  case TableInitId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitTableInit,currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::TableInit>(this);
    goto LAB_00ac5165;
  case TryId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitTry,currp);
    pTVar15 = Expression::cast<wasm::Try>(this);
    uVar29 = (ulong)(uint)(pTVar15->catchBodies).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pTVar15->catchBodies).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
                ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,ppEVar4);
    }
    ppEVar4 = &pTVar15->body;
    goto LAB_00ac5314;
  case TryTableId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitTryTable,currp);
    pTVar7 = Expression::cast<wasm::TryTable>(this);
    goto LAB_00ac4f66;
  case ThrowId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitThrow,currp);
    pTVar24 = Expression::cast<wasm::Throw>(this);
    uVar29 = (ulong)(uint)(pTVar24->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pTVar24->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
                ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,ppEVar4);
    }
    break;
  case RethrowId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitRethrow,currp);
    Expression::cast<wasm::Rethrow>(this);
    return;
  case ThrowRefId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitThrowRef,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::ThrowRef>(this);
    goto LAB_00ac4f66;
  case TupleMakeId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitTupleMake,currp);
    pTVar27 = Expression::cast<wasm::TupleMake>(this);
    uVar29 = (ulong)(uint)(pTVar27->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pTVar27->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
                ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,ppEVar4);
    }
    break;
  case TupleExtractId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitTupleExtract,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::TupleExtract>(this);
    goto LAB_00ac4f66;
  case RefI31Id:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitRefI31,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::RefI31>(this);
    goto LAB_00ac4f66;
  case I31GetId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitI31Get,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::I31Get>(this);
    goto LAB_00ac4f66;
  case CallRefId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitCallRef,currp);
    pCVar9 = Expression::cast<wasm::CallRef>(this);
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,&pCVar9->target);
    uVar29 = (ulong)(uint)(pCVar9->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pCVar9->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
                ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,ppEVar4);
    }
    break;
  case RefTestId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitRefTest,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::RefTest>(this);
    goto LAB_00ac4f66;
  case RefCastId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitRefCast,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::RefCast>(this);
    goto LAB_00ac4f66;
  case BrOnId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitBrOn,currp);
    pSVar21 = (SIMDLoad *)Expression::cast<wasm::BrOn>(this);
LAB_00ac5030:
    ppEVar4 = &pSVar21->ptr;
    goto LAB_00ac5314;
  case StructNewId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitStructNew,currp);
    pSVar20 = Expression::cast<wasm::StructNew>(this);
    uVar29 = (ulong)(uint)(pSVar20->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pSVar20->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
                ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,ppEVar4);
    }
    break;
  case StructGetId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitStructGet,currp);
    pSVar10 = Expression::cast<wasm::StructGet>(this);
    goto LAB_00ac512d;
  case StructSetId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitStructSet,currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::StructSet>(this);
    goto LAB_00ac5096;
  case StructRMWId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitStructRMW,currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::StructRMW>(this);
    goto LAB_00ac5096;
  case StructCmpxchgId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitStructCmpxchg,currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::StructCmpxchg>(this);
LAB_00ac4ef5:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,&pAVar5->timeout);
LAB_00ac4f0e:
    ppEVar4 = &pAVar5->expected;
    goto LAB_00ac50a4;
  case ArrayNewId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitArrayNew,currp);
    pAVar18 = Expression::cast<wasm::ArrayNew>(this);
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,&pAVar18->size);
    ppEVar4 = &pAVar18->init;
LAB_00ac4dcf:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::maybePushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,ppEVar4);
    return;
  case ArrayNewDataId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitArrayNewData,currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::ArrayNewData>(this);
    goto LAB_00ac5174;
  case ArrayNewElemId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitArrayNewElem,currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::ArrayNewElem>(this);
    goto LAB_00ac5174;
  case ArrayNewFixedId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitArrayNewFixed,currp);
    pAVar28 = Expression::cast<wasm::ArrayNewFixed>(this);
    uVar29 = (ulong)(uint)(pAVar28->values).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pAVar28->values).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
                ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,ppEVar4);
    }
    break;
  case ArrayGetId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitArrayGet,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::ArrayGet>(this);
    goto LAB_00ac52fc;
  case ArraySetId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitArraySet,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::ArraySet>(this);
    goto LAB_00ac52ed;
  case ArrayLenId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitArrayLen,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::ArrayLen>(this);
    goto LAB_00ac4f66;
  case ArrayCopyId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitArrayCopy,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::ArrayCopy>(this);
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,
               (Expression **)&(pMVar25->destMemory).super_IString.str._M_str);
    goto LAB_00ac52de;
  case ArrayFillId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitArrayFill,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::ArrayFill>(this);
LAB_00ac52de:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,
               (Expression **)&pMVar25->destMemory);
    goto LAB_00ac52ed;
  case ArrayInitDataId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitArrayInitData,currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::ArrayInitData>(this);
    goto LAB_00ac4a3b;
  case ArrayInitElemId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitArrayInitElem,currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::ArrayInitElem>(this);
LAB_00ac4a3b:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,
               (Expression **)&pAVar12->memory);
LAB_00ac5165:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,&pAVar12->replacement);
LAB_00ac5174:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,&pAVar12->expected);
    ppEVar4 = &pAVar12->ptr;
    goto LAB_00ac5314;
  case RefAsId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitRefAs,currp);
    pSVar10 = (StructGet *)Expression::cast<wasm::RefAs>(this);
    goto LAB_00ac512d;
  case StringNewId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitStringNew,currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::StringNew>(this);
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::maybePushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,&pAVar5->timeout);
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::maybePushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,&pAVar5->expected);
    goto LAB_00ac50af;
  case StringConstId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitStringConst,currp);
    Expression::cast<wasm::StringConst>(this);
    return;
  case StringMeasureId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitStringMeasure,currp);
    pSVar10 = (StructGet *)Expression::cast<wasm::StringMeasure>(this);
LAB_00ac512d:
    ppEVar4 = &pSVar10->ref;
    goto LAB_00ac5314;
  case StringEncodeId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitStringEncode,currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::StringEncode>(this);
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::maybePushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,&pAVar5->timeout);
    goto LAB_00ac4f0e;
  case StringConcatId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitStringConcat,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::StringConcat>(this);
    goto LAB_00ac52fc;
  case StringEqId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitStringEq,currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::StringEq>(this);
LAB_00ac5096:
    ppEVar4 = &pAVar5->expected;
LAB_00ac50a4:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,ppEVar4);
LAB_00ac50af:
    ppEVar4 = &pAVar5->ptr;
    goto LAB_00ac5314;
  case StringWTF16GetId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitStringWTF16Get,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::StringWTF16Get>(this);
    goto LAB_00ac52fc;
  case StringSliceWTFId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitStringSliceWTF,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::StringSliceWTF>(this);
LAB_00ac52ed:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,&pMVar25->size);
LAB_00ac52fc:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,&pMVar25->source);
    ppEVar4 = &pMVar25->dest;
    goto LAB_00ac5314;
  case ContNewId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitContNew,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::ContNew>(this);
LAB_00ac4f66:
    ppEVar4 = &pTVar7->body;
LAB_00ac5314:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,ppEVar4);
    return;
  case ContBindId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitContBind,currp);
    pCVar6 = Expression::cast<wasm::ContBind>(this);
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,&pCVar6->cont);
    uVar29 = (ulong)(uint)(pCVar6->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pCVar6->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
                ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,ppEVar4);
    }
    break;
  case SuspendId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitSuspend,currp);
    pSVar22 = Expression::cast<wasm::Suspend>(this);
    uVar29 = (ulong)(uint)(pSVar22->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pSVar22->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
                ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,ppEVar4);
    }
    break;
  case ResumeId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitResume,currp);
    pRVar2 = Expression::cast<wasm::Resume>(this);
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,&pRVar2->cont);
    uVar29 = (ulong)(uint)(pRVar2->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pRVar2->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
                ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,ppEVar4);
    }
    break;
  case ResumeThrowId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitResumeThrow,currp);
    pRVar26 = Expression::cast<wasm::ResumeThrow>(this);
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,&pRVar26->cont);
    uVar29 = (ulong)(uint)(pRVar26->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pRVar26->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
                ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,ppEVar4);
    }
    break;
  case StackSwitchId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitStackSwitch,currp);
    pSVar3 = Expression::cast<wasm::StackSwitch>(this);
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,&pSVar3->cont);
    uVar29 = (ulong)(uint)(pSVar3->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pSVar3->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
                ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,ppEVar4);
    }
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id)                                                     \
  self->pushTask(SubType::doVisit##id, currp);                                 \
  [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field)                                        \
  self->pushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  self->maybePushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }